

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

void BinaryCache::Terminate(void)

{
  undefined *puVar1;
  CodeDescriptor *pCVar2;
  uint i;
  uint index;
  
  ClearImportPaths();
  if (importPaths != 0) {
    (*(code *)NULLC::dealloc)();
  }
  importPaths = 0;
  uRam0000000000243f70 = 0;
  for (index = 0; puVar1 = NULLC::dealloc, index < DAT_00243f64; index = index + 1) {
    pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    (*(code *)puVar1)(pCVar2->name);
    pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    if (pCVar2->binary != (char *)0x0) {
      operator_delete__(pCVar2->binary);
    }
    pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    if (pCVar2->lexemes != (Lexeme *)0x0) {
      operator_delete__(pCVar2->lexemes);
    }
  }
  uRam0000000000243f60 = uRam0000000000243f60 & 0xffffffff;
  if (cache != 0) {
    (*(code *)NULLC::dealloc)();
  }
  cache = 0;
  uRam0000000000243f60 = 0;
  if (lastBytecode != (void *)0x0) {
    operator_delete__(lastBytecode);
  }
  lastBytecode = (void *)0x0;
  return;
}

Assistant:

void BinaryCache::Terminate()
{
	ClearImportPaths();

	importPaths.reset();

	for(unsigned int i = 0; i < cache.size(); i++)
	{
		NULLC::dealloc((void*)cache[i].name);
		delete[] cache[i].binary;
		delete[] cache[i].lexemes;
	}
	cache.clear();
	cache.reset();

	delete[] lastBytecode;
	lastBytecode = NULL;
}